

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O3

void deqp::gles3::Functional::evalSequenceNoSideEffCase2(ShaderEvalContext *ctx)

{
  undefined8 uVar1;
  float fVar2;
  
  fVar2 = (float)(-(uint)(0.0 < ctx->in[0].m_data[2]) & 0x3f800000);
  uVar1 = *(undefined8 *)(ctx->in[2].m_data + 1);
  *(ulong *)((ctx->color).m_data + 1) =
       CONCAT44((float)(int)(fVar2 + (float)uVar1),
                (float)(int)(fVar2 + (float)((ulong)uVar1 >> 0x20)));
  return;
}

Assistant:

void evalSequenceNoSideEffCase2	(ShaderEvalContext& ctx) { ctx.color.yz()	= sequenceNoSideEffCase2		(ctx.in[0].z() > 0.0f,			ctx.in[1].x() > 0.0f,					ctx.in[2].swizzle(2, 1)).asFloat(); }